

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidgetPrivate::_q_yearEditingFinished(QCalendarWidgetPrivate *this)

{
  QWidget *this_00;
  QCalToolButton *this_01;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  QStringView QVar3;
  QDate currentDate;
  QLocale QStack_68;
  QDate local_60;
  undefined8 local_58;
  bool *pbStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QWidget::hide((QWidget *)this->yearEdit);
  QWidget::setFocusPolicy(this_00,this->oldFocusPolicy);
  QObject::removeEventFilter(QCoreApplication::self);
  QSpacerItem::changeSize(this->spaceHolder,0,0,Minimum,Minimum);
  QWidget::show((QWidget *)this->yearButton);
  local_60.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pbStack_50 = (bool *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this->m_view);
  local_60 = QtPrivate::QCalendarModel::dateForCell(this->m_model,(int)local_58,local_58._4_4_);
  QWidget::locale(&QStack_68,this_00);
  QAbstractSpinBox::text((QString *)&local_58,(QAbstractSpinBox *)this->yearEdit);
  QVar3.m_data = (storage_type_conflict *)local_48.ptr;
  QVar3.m_size = (qsizetype)&QStack_68;
  iVar1 = QLocale::toInt(QVar3,pbStack_50);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  QLocale::~QLocale(&QStack_68);
  iVar2 = QDate::year(&local_60,*(undefined8 *)&this->m_model->m_calendar);
  local_60.jd = QDate::addYears(&local_60,iVar1 - iVar2,*(undefined8 *)&this->m_model->m_calendar);
  this_01 = this->yearButton;
  QWidget::locale(&QStack_68,this_00);
  QLocale::toString((QString *)&local_58,&QStack_68,local_60.jd,4,L"yyyy",
                    *(undefined8 *)&this->m_model->m_calendar);
  QAbstractButton::setText((QAbstractButton *)this_01,(QString *)&local_58);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  QLocale::~QLocale(&QStack_68);
  updateCurrentPage(this,local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_yearEditingFinished()
{
    Q_Q(QCalendarWidget);
    yearEdit->hide();
    q->setFocusPolicy(oldFocusPolicy);
    qApp->removeEventFilter(q);
    spaceHolder->changeSize(0, 0);
    yearButton->show();
    QDate currentDate = getCurrentDate();
    int newYear = q->locale().toInt(yearEdit->text());
    currentDate = currentDate.addYears(newYear - currentDate.year(m_model->m_calendar), m_model->m_calendar);
    yearButton->setText(q->locale().toString(currentDate, u"yyyy", m_model->m_calendar));
    updateCurrentPage(currentDate);
}